

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O1

IterateResult __thiscall gl3cts::ClipDistance::FunctionalTest::iterate(FunctionalTest *this)

{
  GLenum primitive_type;
  char *__s;
  GLchar *pGVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  GLenum GVar5;
  undefined4 extraout_var;
  VertexBufferObject<float> *this_00;
  size_t sVar6;
  size_type sVar7;
  NotSupportedError *this_01;
  socklen_t __len;
  sockaddr *__addr;
  Functions *this_02;
  FunctionalTest *pFVar8;
  GLuint clip_count;
  GLuint i_clip_count;
  uint uVar9;
  string vertex_shader_code;
  VertexArrayObject vertex_array_object;
  vector<float,_std::allocator<float>_> results;
  Framebuffer framebuffer;
  Program program;
  size_type local_3a0;
  string local_390;
  GLenum local_36c;
  undefined1 local_368 [96];
  undefined1 local_308 [48];
  Enum<int,_2UL> local_2d8;
  undefined1 local_2c8 [24];
  char local_2b0 [16];
  pointer local_2a0;
  _Alloc_hider local_298;
  char local_288 [24];
  _Alloc_hider local_270;
  char local_260 [16];
  Functions *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  undefined1 local_230 [48];
  _Alloc_hider local_200;
  size_type local_1f8;
  GLuint local_1e0;
  _Alloc_hider local_1d8;
  size_type local_1d0;
  Functions *local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  Functions *gl;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x103);
  if (!bVar2) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0 = (undefined1  [8])(local_1a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"GL_ARB_clip_distance is not supported","");
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_368._48_8_ = local_2b0;
  sVar7 = 0;
  local_368._72_8_ = gl;
  do {
    primitive_type = m_primitive_types[sVar7];
    local_36c = m_primitive_indices[sVar7];
    __len = 0x20;
    if (primitive_type == 0) {
      __len = 1;
    }
    this_02 = gl;
    Utility::Framebuffer::Framebuffer((Framebuffer *)(local_308 + 0x18),gl,__len,__len);
    Utility::Framebuffer::bind((Framebuffer *)(local_308 + 0x18),(int)this_02,__addr,__len);
    local_368._64_8_ = 4 - (ulong)(sVar7 == 0);
    local_3a0 = 0;
    local_368._56_8_ = sVar7;
    do {
      iVar4 = 0;
      do {
        bVar2 = this->m_gl_max_clip_distances_value == 0;
        if (!bVar2) {
          local_368._88_8_ = " without ";
          if (iVar4 == 1) {
            local_368._88_8_ = " with ";
          }
          local_368._80_8_ = (ulong)(iVar4 != 1) * 3 + 6;
          clip_count = 1;
          do {
            prepareVertexShaderCode_abi_cxx11_
                      (&local_390,(FunctionalTest *)this_02,iVar4 == 1,iVar4 == 1,clip_count,
                       (GLuint)local_3a0,primitive_type);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1b0,m_fragment_shader_code,(allocator<char> *)local_308);
            local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            Utility::Program::Program
                      ((Program *)local_230,gl,&local_390,(string *)local_1b0,&local_248);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_248);
            if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
              operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
            }
            if (local_1e0 == 0) {
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Functional test have failed when building program.\nVertex shader code:\n"
                         ,0x47);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_390._M_dataplus._M_p,local_390._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\nFragment shader code:\n",0x17);
              pGVar1 = m_fragment_shader_code;
              if (m_fragment_shader_code == (GLchar *)0x0) {
                std::ios::clear((int)(ostringstream *)local_1a8 +
                                (int)*(_func_int **)((long)local_1a8 + -0x18));
              }
              else {
                sVar6 = strlen(m_fragment_shader_code);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pGVar1,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              this_02 = (Functions *)&DAT_00000001;
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_FAIL,"Fail");
LAB_00a7dbe7:
              Utility::Program::~Program((Program *)local_230);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390._M_dataplus._M_p != &local_390.field_2) {
                this_02 = (Functions *)(local_390.field_2._M_allocated_capacity + 1);
                operator_delete(local_390._M_dataplus._M_p,(ulong)this_02);
              }
              break;
            }
            (*local_1b8->useProgram)(local_1e0);
            GVar5 = (*local_1b8->getError)();
            glu::checkError(GVar5,"glUseProgram call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                            ,0x5af);
            Utility::Framebuffer::clear((Framebuffer *)(local_308 + 0x18));
            (*gl->enable)(clip_count + 0x2fff);
            pFVar8 = (FunctionalTest *)local_368;
            Utility::VertexArrayObject::VertexArrayObject
                      ((VertexArrayObject *)pFVar8,gl,primitive_type);
            this_00 = prepareGeometry(pFVar8,gl,primitive_type);
            local_2c8._0_8_ = local_230._0_8_;
            local_2c8._8_8_ = local_2b0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_2c8 + 8),local_230._8_8_,
                       (pointer)(local_230._8_8_ + local_230._16_8_));
            local_2a0 = (pointer)local_230._40_8_;
            local_298._M_p = local_288;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,local_200._M_p,local_200._M_p + local_1f8);
            local_270._M_p = local_260;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_270,local_1d8._M_p,local_1d8._M_p + local_1d0);
            local_250 = local_1b8;
            local_368._16_8_ = local_368 + 0x20;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_368 + 0x10),"position","");
            bVar3 = Utility::VertexBufferObject<float>::useAsShaderInput
                              (this_00,(Program *)local_2c8,(string *)(local_368 + 0x10),4);
            if ((undefined1 *)local_368._16_8_ != local_368 + 0x20) {
              operator_delete((void *)local_368._16_8_,local_368._32_8_ + 1);
            }
            Utility::Program::~Program((Program *)local_2c8);
            if (!bVar3) {
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Functional test have failed when enabling vertex attribute array.\n",0x42)
              ;
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_INTERNAL_ERROR,"Error");
              Utility::VertexBufferObject<float>::~VertexBufferObject(this_00);
              this_02 = (Functions *)&DAT_00000030;
              operator_delete(this_00,0x30);
              Utility::VertexArrayObject::~VertexArrayObject((VertexArrayObject *)local_368);
              goto LAB_00a7dbe7;
            }
            (**(glDrawArraysFunc *)(local_368._0_8_ + 0x538))(local_368._12_4_,0,local_36c);
            GVar5 = (**(glGetErrorFunc *)(local_368._0_8_ + 0x800))();
            glu::checkError(GVar5,"glDrawArrays() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                            ,0x650);
            pFVar8 = (FunctionalTest *)local_308;
            Utility::Framebuffer::readPixels
                      ((vector<float,_std::allocator<float>_> *)local_308,
                       (Framebuffer *)(local_308 + 0x18));
            bVar3 = checkResults(pFVar8,primitive_type,(GLuint)local_3a0,
                                 (vector<float,_std::allocator<float>_> *)local_308);
            if (!bVar3) {
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Functional test have failed when drawing ",0x29);
              local_2d8.m_getName = glu::getPrimitiveTypeName;
              local_2d8.m_value = primitive_type;
              tcu::Format::Enum<int,_2UL>::toStream(&local_2d8,(ostream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_368._88_8_,local_368._80_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"dynamic redeclaration, when ",0x1c);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         " GL_CLIP_DISTANCES where enabled and set up using function:\n",0x3c);
              __s = m_clip_function[local_3a0];
              if (__s == (char *)0x0) {
                std::ios::clear((int)local_1a8 + (int)*(_func_int **)((long)local_1a8 + -0x18));
              }
              else {
                sVar6 = strlen(__s);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar6);
              }
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_FAIL,"Fail");
              gl = (Functions *)local_368._72_8_;
            }
            Utility::VertexBufferObject<float>::~VertexBufferObject(this_00);
            this_02 = (Functions *)&DAT_00000030;
            operator_delete(this_00,0x30);
            if ((pointer)local_308._0_8_ != (pointer)0x0) {
              this_02 = (Functions *)(local_308._16_8_ + -local_308._0_8_);
              operator_delete((void *)local_308._0_8_,(ulong)this_02);
            }
            Utility::VertexArrayObject::~VertexArrayObject((VertexArrayObject *)local_368);
            Utility::Program::~Program((Program *)local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_390._M_dataplus._M_p != &local_390.field_2) {
              this_02 = (Functions *)(local_390.field_2._M_allocated_capacity + 1);
              operator_delete(local_390._M_dataplus._M_p,(ulong)this_02);
            }
            if (!bVar3) break;
            clip_count = clip_count + 1;
            bVar2 = (uint)this->m_gl_max_clip_distances_value < clip_count;
          } while (clip_count <= (uint)this->m_gl_max_clip_distances_value);
        }
        if ((bVar2) && (this->m_gl_max_clip_distances_value != 0)) {
          uVar9 = 0;
          do {
            (*gl->disable)(uVar9 + 0x3000);
            uVar9 = uVar9 + 1;
          } while (uVar9 < (uint)this->m_gl_max_clip_distances_value);
        }
        bVar3 = iVar4 == 0;
        iVar4 = iVar4 + 1;
      } while ((bool)(bVar2 & bVar3));
      local_3a0 = local_3a0 + 1;
    } while ((bool)(bVar2 & local_3a0 != local_368._64_8_));
    Utility::Framebuffer::~Framebuffer((Framebuffer *)(local_308 + 0x18));
    if (!bVar2) {
      return STOP;
    }
    sVar7 = local_368._56_8_ + 1;
    if (sVar7 == 3) {
      if (bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult gl3cts::ClipDistance::FunctionalTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should only be executed if we're running a GL>=3.0 context */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)))
	{
		throw tcu::NotSupportedError("GL_ARB_clip_distance is not supported");
	}

	/* Functional test */

	/* For all primitive modes. */
	for (glw::GLuint i_primitive_type = 0; i_primitive_type < m_primitive_types_count; ++i_primitive_type)
	{
		glw::GLenum primitive_type			= m_primitive_types[i_primitive_type];
		glw::GLenum primitive_indices_count = m_primitive_indices[i_primitive_type];

		/* Framebuffer setup. */
		glw::GLuint framebuffer_size = (primitive_type == GL_POINTS) ? 1 : 32;

		gl3cts::ClipDistance::Utility::Framebuffer framebuffer(gl, framebuffer_size,
															   framebuffer_size); /* Framebuffer shall be square */

		framebuffer.bind();

		/* For all clip combinations. */
		for (glw::GLuint i_clip_function = 0;
			 i_clip_function <
			 m_clip_function_count -
				 int(i_primitive_type == GL_POINTS); /* Do not use last clip function with GL_POINTS. */
			 ++i_clip_function)
		{
			/* For both redeclaration types (implicit/explicit). */
			for (glw::GLuint i_redeclaration = 0; i_redeclaration < 2; ++i_redeclaration)
			{
				bool redeclaration = (i_redeclaration == 1);

				/* For different clip array sizes. */
				for (glw::GLuint i_clip_count = 1; i_clip_count <= glw::GLuint(m_gl_max_clip_distances_value);
					 ++i_clip_count)
				{
					/* Create and build program. */
					std::string vertex_shader_code = gl3cts::ClipDistance::FunctionalTest::prepareVertexShaderCode(
						redeclaration, redeclaration, i_clip_count, i_clip_function, primitive_type);

					gl3cts::ClipDistance::Utility::Program program(gl, vertex_shader_code, m_fragment_shader_code);

					if (program.ProgramStatus().program_id == GL_NONE)
					{
						/* Result's setup. */
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Functional test have failed when building program.\nVertex shader code:\n"
							<< vertex_shader_code << "\nFragment shader code:\n"
							<< m_fragment_shader_code << "\n"
							<< tcu::TestLog::EndMessage;

						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

						return STOP;
					}

					program.UseProgram();

					/* Framebuffer clear */
					framebuffer.clear();

					/* Clip setup */
					gl.enable(GL_CLIP_DISTANCE0 + i_clip_count - 1);

					/* Geometry Setup */
					gl3cts::ClipDistance::Utility::VertexArrayObject vertex_array_object(gl, primitive_type);

					gl3cts::ClipDistance::Utility::VertexBufferObject<glw::GLfloat>* vertex_buffer_object =
						prepareGeometry(gl, primitive_type);

					if (!vertex_buffer_object->useAsShaderInput(program, "position", 4))
					{
						/* Result's setup. */
						m_testCtx.getLog() << tcu::TestLog::Message
										   << "Functional test have failed when enabling vertex attribute array.\n"
										   << tcu::TestLog::EndMessage;

						m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");

						delete vertex_buffer_object;
						return STOP;
					}

					/* Draw geometry to the framebuffer */
					vertex_array_object.draw(0, primitive_indices_count);

					/* Check results */
					std::vector<glw::GLfloat> results = framebuffer.readPixels();

					if (!checkResults(primitive_type, i_clip_function, results))
					{
						/* Result's setup. */
						m_testCtx.getLog() << tcu::TestLog::Message << "Functional test have failed when drawing "
										   << glu::getPrimitiveTypeStr(primitive_type)
										   << ((redeclaration) ? " with " : " without ")
										   << "dynamic redeclaration, when " << i_clip_count
										   << " GL_CLIP_DISTANCES where enabled and set up using function:\n"
										   << m_clip_function[i_clip_function] << tcu::TestLog::EndMessage;

						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

						delete vertex_buffer_object;
						return STOP;
					}

					delete vertex_buffer_object;
				}

				/* Clip clean */
				for (glw::GLuint i_clip_count = 0; i_clip_count < glw::GLuint(m_gl_max_clip_distances_value);
					 ++i_clip_count)
				{
					gl.disable(GL_CLIP_DISTANCE0 + i_clip_count);
				}
			}
		}
	}

	/* Result's setup. */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}